

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O3

int Curl_str_until(char **linep,Curl_str *out,size_t max,char delim)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  
  pcVar2 = *linep;
  out->str = (char *)0x0;
  out->len = 0;
  sVar3 = 0;
  while ((cVar1 = pcVar2[sVar3], cVar1 != '\0' && (cVar1 != delim))) {
    sVar3 = sVar3 + 1;
    if (max < sVar3) {
      return 1;
    }
  }
  if (sVar3 != 0) {
    out->str = *linep;
    out->len = sVar3;
    *linep = pcVar2 + sVar3;
    return 0;
  }
  return 2;
}

Assistant:

int Curl_str_until(const char **linep, struct Curl_str *out,
                   const size_t max, char delim)
{
  const char *s = *linep;
  size_t len = 0;
  DEBUGASSERT(linep && *linep && out && max && delim);

  Curl_str_init(out);
  while(*s && (*s != delim)) {
    s++;
    if(++len > max) {
      return STRE_BIG;
    }
  }
  if(!len)
    return STRE_SHORT;
  out->str = *linep;
  out->len = len;
  *linep = s; /* point to the first byte after the word */
  return STRE_OK;
}